

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>::_validate
          (JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq> *this,JsonVal *jsonVal)

{
  unsigned_long_long lower;
  ulong uVar1;
  longlong upper;
  ulong upper_00;
  JsonArrayVal *pJVar2;
  JsonVal *this_00;
  JsonVal *this_01;
  JsonUIntVal *pJVar3;
  JsonSIntVal *pJVar4;
  
  JsonArrayValReq::_validate(&this->super_JsonArrayValReq,jsonVal);
  pJVar2 = JsonVal::asArray(jsonVal);
  this_00 = ArrayItemMixin<yactfr::internal::JsonVal>::_at
                      (&pJVar2->super_ArrayItemMixin<yactfr::internal::JsonVal>,0);
  pJVar2 = JsonVal::asArray(jsonVal);
  this_01 = ArrayItemMixin<yactfr::internal::JsonVal>::_at
                      (&pJVar2->super_ArrayItemMixin<yactfr::internal::JsonVal>,1);
  if ((this_00->super_ItemMixin<yactfr::internal::JsonValKind>)._theKind == UInt) {
    pJVar3 = JsonVal::asUInt(this_00);
    lower = (pJVar3->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
    if ((this_01->super_ItemMixin<yactfr::internal::JsonValKind>)._theKind == UInt) {
      pJVar3 = JsonVal::asUInt(this_01);
      uVar1 = (pJVar3->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
      if (uVar1 < lower) {
        _throwLowerGtUpper<unsigned_long_long,unsigned_long_long>(lower,uVar1,&jsonVal->_loc);
      }
    }
    else {
      pJVar4 = JsonVal::asSInt(this_01);
      uVar1 = (pJVar4->super_ScalarValItemMixin<long_long>)._theVal;
      if ((long)uVar1 < 0) {
        _throwLowerGtUpper<unsigned_long_long,long_long>(lower,uVar1,&jsonVal->_loc);
      }
      if (uVar1 < lower) {
        _throwLowerGtUpper<unsigned_long_long,long_long>(lower,uVar1,&jsonVal->_loc);
      }
    }
  }
  else {
    pJVar4 = JsonVal::asSInt(this_00);
    uVar1 = (pJVar4->super_ScalarValItemMixin<long_long>)._theVal;
    if ((this_01->super_ItemMixin<yactfr::internal::JsonValKind>)._theKind == SInt) {
      pJVar4 = JsonVal::asSInt(this_01);
      upper = (pJVar4->super_ScalarValItemMixin<long_long>)._theVal;
      if (upper < (long)uVar1) {
        _throwLowerGtUpper<long_long,long_long>(uVar1,upper,&jsonVal->_loc);
      }
    }
    else if (-1 < (long)uVar1) {
      pJVar3 = JsonVal::asUInt(this_01);
      upper_00 = (pJVar3->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
      if (upper_00 < uVar1) {
        _throwLowerGtUpper<long_long,unsigned_long_long>(uVar1,upper_00,&jsonVal->_loc);
      }
    }
  }
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonArrayValReq::_validate(jsonVal);

            /*
             * Here's the truth table:
             *
             * ╔════╦════════════╦════════════╦═══════════════════════════╗
             * ║ ID ║ Lower      ║ Upper      ║ Valid?                    ║
             * ╠════╬════════════╬════════════╬═══════════════════════════╣
             * ║ 1  ║ Unsigned   ║ Unsigned   ║ Lower < upper             ║
             * ║ 2  ║ Signed     ║ Signed     ║ Lower < upper             ║
             * ║ 3  ║ Unsigned   ║ Signed ≥ 0 ║ Lower < upper as unsigned ║
             * ║ 4  ║ Unsigned   ║ Signed < 0 ║ No                        ║
             * ║ 5  ║ Signed ≥ 0 ║ Unsigned   ║ Lower as unsigned < upper ║
             * ║ 6  ║ Signed < 0 ║ Unsigned   ║ Yes                       ║
             * ╚════╩════════════╩════════════╩═══════════════════════════╝
             */
            auto& lowerJsonVal = jsonVal.asArray()[0];
            auto& upperJsonVal = jsonVal.asArray()[1];

            if (lowerJsonVal.isUInt()) {
                const auto uLower = *lowerJsonVal.asUInt();

                if (upperJsonVal.isUInt()) {
                    const auto uUpper = *upperJsonVal.asUInt();

                    if (uUpper < uLower) {
                        // ID 1
                        this->_throwLowerGtUpper(uLower, uUpper, jsonVal.loc());
                    }
                } else {
                    const auto sUpper = *upperJsonVal.asSInt();

                    if (sUpper < 0) {
                        // ID 4
                        this->_throwLowerGtUpper(uLower, sUpper, jsonVal.loc());
                    }

                    if (static_cast<unsigned long long>(sUpper) < uLower) {
                        // ID 3
                        this->_throwLowerGtUpper(uLower, sUpper, jsonVal.loc());
                    }
                }
            } else {
                const auto sLower = *lowerJsonVal.asSInt();

                if (upperJsonVal.isSInt()) {
                    const auto sUpper = *upperJsonVal.asSInt();

                    if (sUpper < sLower) {
                        // ID 2
                        this->_throwLowerGtUpper(sLower, sUpper, jsonVal.loc());
                    }
                } else if (sLower >= 0) {
                    const auto uUpper = *upperJsonVal.asUInt();

                    if (uUpper < static_cast<unsigned long long>(sLower)) {
                        // ID 5
                        this->_throwLowerGtUpper(sLower, uUpper, jsonVal.loc());
                    }
                }
            }
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid integer range:", jsonVal.loc());
            throw;
        }
    }